

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O3

void read_register(rtc_t *rtc)

{
  rtc_t *rtc_00;
  gbabus_t *pgVar1;
  rtc_state_t rVar2;
  tm *ptVar3;
  byte bVar4;
  uint8_t *puVar5;
  char *pcVar6;
  undefined8 uVar7;
  time_t rawtime;
  time_t tStack_18;
  
  switch(rtc->reg) {
  case '\0':
    puts("RESET");
    rtc->buffer = 0;
    (rtc->control_reg).raw = '\0';
    return;
  default:
    puVar5 = &rtc->reg;
    read_register_cold_1();
    *(undefined8 *)(puVar5 + 0x10) = 0;
    if (puVar5[0x20] == '\x04') {
      uVar7 = 0xff;
      if (gba_log_verbosity < 3) goto LAB_0011fb7a;
      pcVar6 = "[DEBUG] [GPIO] We\'re gonna write to STATUS_REGISTER_2";
    }
    else {
      if (puVar5[0x20] != '\0') {
        bVar4 = (char)puVar5 + 0x20;
        write_register_cold_1();
        pgVar1 = bus;
        if (2 < gba_log_verbosity) {
          pcVar6 = "Read";
          if (bVar4 < 8) {
            pcVar6 = "Writ";
          }
          printf("[DEBUG] [GPIO] [RTC] %sing register: 0x%X\n",pcVar6,(ulong)(bVar4 & 7));
        }
        rtc_00 = &pgVar1->rtc;
        (pgVar1->rtc).reg = bVar4 & 7;
        if (bVar4 < 8) {
          write_register(rtc_00);
          rVar2 = RTC_DATA_WRITE;
        }
        else {
          read_register(rtc_00);
          rVar2 = RTC_DATA_READ;
        }
        rtc_00->state = rVar2;
        return;
      }
      uVar7 = 0;
      if (gba_log_verbosity < 3) goto LAB_0011fb7a;
      pcVar6 = "[DEBUG] [GPIO] We\'re gonna write to RESET";
    }
    puts(pcVar6);
LAB_0011fb7a:
    *(undefined8 *)(puVar5 + 0x18) = uVar7;
    return;
  case '\x02':
    time(&tStack_18);
    ptVar3 = localtime(&tStack_18);
    bVar4 = to_bcd((uint8_t)ptVar3->tm_sec);
    rtc->buffer = (ulong)bVar4 << 8;
    bVar4 = to_bcd((uint8_t)ptVar3->tm_min);
    rtc->buffer = ((ulong)bVar4 | rtc->buffer) << 8;
    bVar4 = to_bcd((uint8_t)ptVar3->tm_hour);
    rtc->buffer = ((ulong)bVar4 | rtc->buffer) << 8;
    bVar4 = to_bcd((uint8_t)ptVar3->tm_wday);
    rtc->buffer = ((ulong)bVar4 | rtc->buffer) << 8;
    bVar4 = to_bcd((uint8_t)ptVar3->tm_mday);
    rtc->buffer = ((ulong)bVar4 | rtc->buffer) << 8;
    bVar4 = to_bcd((char)ptVar3->tm_mon + '\x01');
    rtc->buffer = ((ulong)bVar4 | rtc->buffer) << 8;
    bVar4 = to_bcd((char)ptVar3->tm_year + 0x9c);
    rtc->buffer = (ulong)bVar4 | rtc->buffer;
    pcVar6 = "DATETIME_REG: 0x%012lX\n";
    break;
  case '\x04':
    rtc->buffer = (ulong)(rtc->control_reg).raw;
    (rtc->control_reg).raw = (rtc->control_reg).raw & 0x7f;
    printf("CONTROL_REG: 0x%02lX\n");
    return;
  case '\x06':
    time(&tStack_18);
    ptVar3 = localtime(&tStack_18);
    bVar4 = to_bcd((uint8_t)ptVar3->tm_sec);
    rtc->buffer = (ulong)bVar4 << 8;
    bVar4 = to_bcd((uint8_t)ptVar3->tm_min);
    rtc->buffer = ((ulong)bVar4 | rtc->buffer) << 8;
    bVar4 = to_bcd((uint8_t)ptVar3->tm_hour);
    rtc->buffer = (ulong)bVar4 | rtc->buffer;
    pcVar6 = "TIME_REG: 0x%lX\n";
  }
  printf(pcVar6);
  return;
}

Assistant:

void read_register(rtc_t* rtc) {
    switch (rtc->reg) {
        case RESET_REG:
            printf("RESET\n");
            rtc->buffer = 0;
            rtc->control_reg.raw = 0;
            break;
        case DATETIME_REG: {
            time_t rawtime;
            struct tm *timeinfo;
            time(&rawtime);
            timeinfo = localtime(&rawtime);

            rtc->buffer = to_bcd(timeinfo->tm_sec);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_min);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_hour);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_wday);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_mday);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_mon + 1);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_year - 100);
            printf("DATETIME_REG: 0x%012lX\n", rtc->buffer);
            break;
        }
        case CONTROL_REG:
            rtc->buffer = rtc->control_reg.raw;
            rtc->control_reg.poweroff = 0;
            printf("CONTROL_REG: 0x%02lX\n", rtc->buffer);
            break;
        case TIME_REG: {
            time_t rawtime;
            struct tm *timeinfo;
            time(&rawtime);
            timeinfo = localtime(&rawtime);

            rtc->buffer = to_bcd(timeinfo->tm_sec);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_min);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_hour);

            printf("TIME_REG: 0x%lX\n", rtc->buffer);
            break;
        }
        default:
            logfatal("Reading unknown register: 0x%X", rtc->reg)
    }

}